

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O3

time_t xstrpisotime(char *s,char **endptr)

{
  char cVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  time_t tVar13;
  char *local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  char *local_18;
  
  local_28 = (undefined1  [16])0x0;
  local_38 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_18 = (char *)0x0;
  ppuVar4 = __ctype_b_loc();
  do {
    pcVar12 = s;
    s = pcVar12 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (long)*pcVar12 * 2 + 1) & 0x20) != 0);
  bVar8 = *pcVar12 - 0x30;
  iVar6 = 0;
  pcVar5 = pcVar12;
  if (bVar8 < 10) {
    iVar11 = 0;
    iVar9 = 0xfff;
    pcVar3 = pcVar12 + 1;
    do {
      pcVar5 = pcVar3;
      iVar6 = (uint)bVar8 + iVar11;
      if ((0x199 < iVar6) || (0xffffffec < iVar9 - 10U)) break;
      iVar9 = iVar9 / 10;
      iVar11 = iVar6 * 10;
      bVar8 = *pcVar5 - 0x30;
      pcVar3 = pcVar5 + 1;
    } while (bVar8 < 10);
  }
  iVar9 = -2;
  if (0xfffff62e < iVar6 - 0x1000U) {
    iVar9 = iVar6;
  }
  iVar6 = -1;
  if (pcVar12 != pcVar5) {
    iVar6 = iVar9;
  }
  local_38._4_4_ = iVar6;
  tVar13 = -1;
  local_50 = pcVar5;
  if (((-1 < iVar6) && (local_50 = pcVar5 + 1, *pcVar5 == '-')) &&
     (bVar8 = *local_50 - 0x30, bVar8 < 10)) {
    iVar6 = 0;
    uVar7 = 0xc;
    pcVar12 = pcVar5 + 2;
    do {
      pcVar5 = pcVar12;
      local_38._0_4_ = (uint)bVar8 + iVar6;
      if ((1 < (int)local_38._0_4_) || (0xffffffec < uVar7 - 10)) break;
      uVar7 = uVar7 / 10;
      iVar6 = local_38._0_4_ * 10;
      bVar8 = *pcVar5 - 0x30;
      pcVar12 = pcVar5 + 1;
    } while (bVar8 < 10);
    local_50 = pcVar5;
    if (0xfffffff3 < local_38._0_4_ - 0xd) {
      local_50 = pcVar5 + 1;
      if ((*pcVar5 == '-') && (bVar8 = *local_50 - 0x30, bVar8 < 10)) {
        iVar6 = 0;
        uVar7 = 0x1f;
        pcVar12 = pcVar5 + 2;
        do {
          pcVar5 = pcVar12;
          iVar9 = (uint)bVar8 + iVar6;
          if ((3 < iVar9) || (0xffffffec < uVar7 - 10)) break;
          uVar7 = uVar7 / 10;
          iVar6 = iVar9 * 10;
          bVar8 = *pcVar5 - 0x30;
          pcVar12 = pcVar5 + 1;
        } while (bVar8 < 10);
        local_50 = pcVar5;
        if (((0xffffffe0 < iVar9 - 0x20U) && (local_50 = pcVar5 + 1, *pcVar5 == 'T')) &&
           (bVar8 = *local_50 - 0x30, bVar8 < 10)) {
          iVar6 = 0;
          uVar7 = 0x17;
          pcVar12 = pcVar5 + 2;
          do {
            pcVar5 = pcVar12;
            uVar10 = (uint)bVar8 + iVar6;
            if ((2 < (int)uVar10) || (0xffffffec < uVar7 - 10)) break;
            uVar7 = uVar7 / 10;
            iVar6 = uVar10 * 10;
            bVar8 = *pcVar5 - 0x30;
            pcVar12 = pcVar5 + 1;
          } while (bVar8 < 10);
          local_50 = pcVar5;
          if (uVar10 < 0x18) {
            local_48._8_4_ = uVar10;
            local_48._12_4_ = iVar9;
            local_50 = pcVar5 + 1;
            if (*pcVar5 == ':') {
              iVar6 = strtoi_lim(local_50,&local_50,0,0x3b);
              local_48._4_4_ = iVar6;
              if ((-1 < iVar6) &&
                 (pcVar12 = local_50 + 1, cVar1 = *local_50, local_50 = pcVar12, cVar1 == ':')) {
                iVar6 = strtoi_lim(pcVar12,&local_50,0,0x3c);
                auVar2 = local_38;
                local_48._0_4_ = iVar6;
                if ((-1 < iVar6) &&
                   (pcVar12 = local_50 + 1, cVar1 = *local_50, local_50 = pcVar12, cVar1 == 'Z')) {
                  iVar6 = local_38._0_4_;
                  local_38._4_4_ = local_38._4_4_ + -0x76c;
                  local_38._0_4_ = iVar6 + -1;
                  local_38._8_8_ = auVar2._8_8_;
                  tVar13 = timegm((tm *)local_48);
                }
              }
            }
          }
        }
      }
    }
  }
  if (endptr != (char **)0x0) {
    *endptr = local_50;
  }
  return tVar13;
}

Assistant:

static time_t
xstrpisotime(const char *s, char **endptr)
{
/** like strptime() but strictly for ISO 8601 Zulu strings */
	struct tm tm;
	time_t res = (time_t)-1;

	/* make sure tm is clean */
	memset(&tm, 0, sizeof(tm));

	/* as a courtesy to our callers, and since this is a non-standard
	 * routine, we skip leading whitespace */
	for (; isspace(*s); s++);

	/* read year */
	if ((tm.tm_year = strtoi_lim(s, &s, 1583, 4095)) < 0 || *s++ != '-') {
		goto out;
	}
	/* read month */
	if ((tm.tm_mon = strtoi_lim(s, &s, 1, 12)) < 0 || *s++ != '-') {
		goto out;
	}
	/* read day-of-month */
	if ((tm.tm_mday = strtoi_lim(s, &s, 1, 31)) < 0 || *s++ != 'T') {
		goto out;
	}
	/* read hour */
	if ((tm.tm_hour = strtoi_lim(s, &s, 0, 23)) < 0 || *s++ != ':') {
		goto out;
	}
	/* read minute */
	if ((tm.tm_min = strtoi_lim(s, &s, 0, 59)) < 0 || *s++ != ':') {
		goto out;
	}
	/* read second */
	if ((tm.tm_sec = strtoi_lim(s, &s, 0, 60)) < 0 || *s++ != 'Z') {
		goto out;
	}

	/* massage TM to fulfill some of POSIX' contraints */
	tm.tm_year -= 1900;
	tm.tm_mon--;

	/* now convert our custom tm struct to a unix stamp using UTC */
	res = time_from_tm(&tm);

out:
	if (endptr != NULL) {
		*endptr = deconst(s);
	}
	return res;
}